

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O3

void __thiscall tst_GenericModel::removeColumns(tst_GenericModel *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  uint *puVar7;
  QMetaType QVar8;
  char *pcVar9;
  char *pcVar10;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  GenericModel testModel;
  QModelIndex t;
  QSignalSpy *spyArr [2];
  value_type args;
  char msg [128];
  ModelTest probe;
  QSignalSpy columnsRemovedSpy;
  QSignalSpy columnsAboutToBeRemovedSpy;
  char *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  QModelIndex local_230;
  QModelIndex local_218;
  QSignalSpy *local_1f8 [3];
  anon_union_24_3_e3d07ef4_for_data local_1e0;
  anon_union_24_3_e3d07ef4_for_data local_1c8 [5];
  undefined **local_140 [2];
  QSignalSpy local_130;
  QSignalSpy local_b0;
  
  puVar7 = (uint *)QTest::qData("insertRow",2);
  uVar1 = *puVar7;
  GenericModel::GenericModel((GenericModel *)&local_230,(QObject *)0x0);
  QAbstractItemModelTester::QAbstractItemModelTester
            ((QAbstractItemModelTester *)local_140,(QAbstractItemModel *)&local_230,QtTest,
             (QObject *)0x0);
  local_140[0] = &PTR_metaObject_001659f8;
  if (0 < (int)uVar1) {
    local_1c8[0]._forAlignment = -NAN;
    local_1c8[0]._8_8_ = 0;
    local_1c8[0]._16_8_ = 0;
    GenericModel::insertRows((int)&local_230,0,(QModelIndex *)(ulong)uVar1);
  }
  local_1c8[0]._forAlignment = -NAN;
  local_1c8[0]._8_8_ = (QVariant *)0x0;
  local_1c8[0]._16_8_ = 0;
  bVar3 = (bool)GenericModel::insertColumns((int)&local_230,0,(QModelIndex *)0xd);
  cVar4 = QTest::qVerify(bVar3,"testModel.insertColumns(0, 13)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x18e);
  if (cVar4 == '\0') goto LAB_0010cf4b;
  QVariant::QVariant((QVariant *)local_1c8,1);
  GenericModel::setHeaderData((int)&local_230,10,(QVariant *)0x1,(int)local_1c8);
  QVariant::~QVariant((QVariant *)local_1c8);
  QSignalSpy::QSignalSpy
            (&local_b0,(QObject *)&local_230,"2columnsAboutToBeRemoved(QModelIndex, int, int)");
  cVar4 = QTest::qVerify(local_b0.sig.d.size != 0,"columnsAboutToBeRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x192);
  if (cVar4 != '\0') {
    QSignalSpy::QSignalSpy
              (&local_130,(QObject *)&local_230,"2columnsRemoved(QModelIndex, int, int)");
    cVar4 = QTest::qVerify(local_130.sig.d.size != 0,"columnsRemovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x194);
    if (cVar4 != '\0') {
      local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
      local_1c8[0]._8_8_ = (QVariant *)0x0;
      local_1c8[0]._16_8_ = 0;
      local_1f8[0] = &local_130;
      local_1f8[1] = &local_b0;
      bVar3 = (bool)GenericModel::removeColumns((int)&local_230,0,(QModelIndex *)0x1);
      cVar4 = QTest::qVerify(bVar3,"testModel.removeColumns(0, 1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x197);
      if (cVar4 != '\0') {
        local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
        local_1c8[0]._8_8_ = (QVariant *)0x0;
        local_1c8[0]._16_8_ = 0;
        iVar6 = GenericModel::columnCount(&local_230);
        cVar4 = QTest::qCompare(iVar6,0xc,"testModel.columnCount()","12",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x198);
        if (cVar4 != '\0') {
          lVar14 = 0;
          do {
            lVar2 = *(long *)((long)local_1f8 + lVar14);
            cVar4 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x19a);
            if (cVar4 == '\0') goto LAB_0010ce3d;
            QList<QList<QVariant>_>::takeFirst
                      ((value_type *)&local_1e0,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
            iVar6 = QVariant::toInt((bool *)(local_1e0._8_8_ + 0x40));
            cVar4 = QTest::qCompare(iVar6,0,"args.at(2).toInt()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x19c);
            if (cVar4 == '\0') {
LAB_0010ce33:
              this_00 = &local_1e0;
              goto LAB_0010ce38;
            }
            iVar6 = QVariant::toInt((bool *)(local_1e0._8_8_ + 0x20));
            cVar4 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x19d);
            uVar13 = local_1e0._8_8_;
            if (cVar4 == '\0') goto LAB_0010ce33;
            QVar8.d_ptr._4_4_ = in_stack_fffffffffffffdc4;
            QVar8.d_ptr._0_4_ = in_stack_fffffffffffffdc0;
            bVar3 = operator==(QVar8,(QMetaType)in_stack_fffffffffffffdb8);
            if (bVar3) {
              if ((*(byte *)(uVar13 + 0x18) & 1) != 0) {
                uVar13 = (long)*(int *)(*(ulong *)uVar13 + 4) + *(ulong *)uVar13;
              }
              local_218.m = *(QAbstractItemModel **)(uVar13 + 0x10);
              local_218._0_8_ = *(undefined8 *)uVar13;
              local_218.i = *(ulong *)(uVar13 + 8);
            }
            else {
              local_218.r = -1;
              local_218.c = -1;
              local_218.i = 0;
              local_218.m = (QAbstractItemModel *)0x0;
              QVar8.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
              if ((*(byte *)(uVar13 + 0x18) & 1) != 0) {
                uVar13 = (long)*(int *)(*(ulong *)uVar13 + 4) + *(ulong *)uVar13;
              }
              QMetaType::convert(QVar8,(void *)uVar13,(QMetaType)0x1666b8,&local_218);
            }
            uVar12 = local_218.i;
            if ((local_218.r == -1) && (local_218.i == 0)) {
              if (local_218.c != 0xffffffff) {
                uVar12 = 0;
                goto LAB_0010cd65;
              }
              bVar3 = local_218.m == (QAbstractItemModel *)0x0;
              uVar11 = 0xffffffff;
              uVar12 = 0;
            }
            else {
LAB_0010cd65:
              uVar11 = (ulong)(uint)local_218.c;
              bVar3 = false;
            }
            qsnprintf((char *)local_1c8[0].data,0x80,"QModelIndex(%d,%d,%p,%p)",
                      local_218._0_8_ & 0xffffffff,uVar11,uVar12,local_218.m);
            pcVar9 = (char *)qstrdup((char *)local_1c8[0].data);
            qsnprintf((char *)local_1c8[0].data,0x80,"QModelIndex(%d,%d,%p,%p)",0xffffffff,
                      0xffffffff,0,0);
            pcVar10 = (char *)qstrdup((char *)local_1c8[0].data);
            in_stack_fffffffffffffdb8 =
                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
            ;
            in_stack_fffffffffffffdc0 = 0x19e;
            cVar4 = QTest::compare_helper
                              (bVar3,"Compared values are not the same",pcVar9,pcVar10,
                               "args.at(0).value<QModelIndex>()","QModelIndex()",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x19e);
            QArrayDataPointer<QVariant>::~QArrayDataPointer
                      ((QArrayDataPointer<QVariant> *)&local_1e0);
            if (cVar4 == '\0') goto LAB_0010ce3d;
            lVar14 = lVar14 + 8;
          } while (lVar14 != 0x10);
          GenericModel::headerData((int)local_1c8,(Orientation)&local_230,9);
          iVar6 = QVariant::toInt((bool *)local_1c8[0].data);
          cVar4 = QTest::qCompare(iVar6,1,"testModel.headerData(9, Qt::Horizontal).toInt()","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x1a0);
          QVariant::~QVariant((QVariant *)local_1c8);
          if (cVar4 != '\0') {
            local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
            local_1c8[0]._8_8_ = (QVariant *)0x0;
            local_1c8[0]._16_8_ = 0;
            bVar3 = (bool)GenericModel::removeColumns((int)&local_230,0,(QModelIndex *)0x2);
            cVar4 = QTest::qVerify(bVar3,"testModel.removeColumns(0, 2)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x1a1);
            if (cVar4 != '\0') {
              local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
              local_1c8[0]._8_8_ = (QVariant *)0x0;
              local_1c8[0]._16_8_ = 0;
              iVar6 = GenericModel::columnCount(&local_230);
              cVar4 = QTest::qCompare(iVar6,10,"testModel.columnCount()","10",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x1a2);
              if (cVar4 != '\0') {
                lVar14 = 0;
                do {
                  lVar2 = *(long *)((long)local_1f8 + lVar14);
                  cVar4 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x1a4);
                  if (cVar4 == '\0') goto LAB_0010ce3d;
                  QList<QList<QVariant>_>::takeFirst
                            ((value_type *)local_1c8,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
                  iVar6 = QVariant::toInt((bool *)(local_1c8[0]._8_8_ + 0x40));
                  cVar4 = QTest::qCompare(iVar6,1,"args.at(2).toInt()","1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x1a6);
                  if (cVar4 == '\0') goto LAB_0010d82b;
                  iVar6 = QVariant::toInt((bool *)(local_1c8[0]._8_8_ + 0x20));
                  cVar4 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x1a7);
                  if (cVar4 == '\0') goto LAB_0010d82b;
                  QVariant::value<QModelIndex>
                            ((QModelIndex *)&local_1e0,(QVariant *)local_1c8[0]._8_8_);
                  local_218.r = -1;
                  local_218.c = -1;
                  local_218.i = 0;
                  local_218.m = (QAbstractItemModel *)0x0;
                  bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                    ((QModelIndex *)&local_1e0,&local_218,
                                     "args.at(0).value<QModelIndex>()","QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x1a8);
                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                            ((QArrayDataPointer<QVariant> *)local_1c8);
                  if (!bVar3) goto LAB_0010ce3d;
                  lVar14 = lVar14 + 8;
                } while (lVar14 != 0x10);
                GenericModel::headerData((int)local_1c8,(Orientation)&local_230,7);
                iVar6 = QVariant::toInt((bool *)local_1c8[0].data);
                cVar4 = QTest::qCompare(iVar6,1,"testModel.headerData(7, Qt::Horizontal).toInt()",
                                        "1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x1aa);
                QVariant::~QVariant((QVariant *)local_1c8);
                if (cVar4 != '\0') {
                  local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
                  local_1c8[0]._8_8_ = (QVariant *)0x0;
                  local_1c8[0]._16_8_ = 0;
                  bVar3 = (bool)GenericModel::removeColumns((int)&local_230,2,(QModelIndex *)0x2);
                  cVar4 = QTest::qVerify(bVar3,"testModel.removeColumns(2, 2)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x1ac);
                  if (cVar4 != '\0') {
                    local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
                    local_1c8[0]._8_8_ = (QVariant *)0x0;
                    local_1c8[0]._16_8_ = 0;
                    iVar6 = GenericModel::columnCount(&local_230);
                    cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x1ad);
                    if (cVar4 != '\0') {
                      lVar14 = 0;
                      do {
                        lVar2 = *(long *)((long)local_1f8 + lVar14);
                        cVar4 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1af);
                        if (cVar4 == '\0') goto LAB_0010ce3d;
                        QList<QList<QVariant>_>::takeFirst
                                  ((value_type *)local_1c8,(QList<QList<QVariant>_> *)(lVar2 + 0x10)
                                  );
                        iVar6 = QVariant::toInt((bool *)(local_1c8[0]._8_8_ + 0x40));
                        cVar4 = QTest::qCompare(iVar6,3,"args.at(2).toInt()","3",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1b1);
                        if (cVar4 == '\0') goto LAB_0010d82b;
                        iVar6 = QVariant::toInt((bool *)(local_1c8[0]._8_8_ + 0x20));
                        cVar4 = QTest::qCompare(iVar6,2,"args.at(1).toInt()","2",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1b2);
                        if (cVar4 == '\0') goto LAB_0010d82b;
                        QVariant::value<QModelIndex>
                                  ((QModelIndex *)&local_1e0,(QVariant *)local_1c8[0]._8_8_);
                        local_218.r = -1;
                        local_218.c = -1;
                        local_218.i = 0;
                        local_218.m = (QAbstractItemModel *)0x0;
                        bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                          ((QModelIndex *)&local_1e0,&local_218,
                                           "args.at(0).value<QModelIndex>()","QModelIndex()",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x1b3);
                        QArrayDataPointer<QVariant>::~QArrayDataPointer
                                  ((QArrayDataPointer<QVariant> *)local_1c8);
                        if (!bVar3) goto LAB_0010ce3d;
                        lVar14 = lVar14 + 8;
                      } while (lVar14 != 0x10);
                      GenericModel::headerData((int)local_1c8,(Orientation)&local_230,5);
                      iVar6 = QVariant::toInt((bool *)local_1c8[0].data);
                      cVar4 = QTest::qCompare(iVar6,1,
                                              "testModel.headerData(5, Qt::Horizontal).toInt()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x1b5);
                      QVariant::~QVariant((QVariant *)local_1c8);
                      if (cVar4 != '\0') {
                        local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
                        local_1c8[0]._8_8_ = (QVariant *)0x0;
                        local_1c8[0]._16_8_ = 0;
                        bVar5 = GenericModel::removeColumns((int)&local_230,0,(QModelIndex *)0x0);
                        cVar4 = QTest::qVerify((bool)(bVar5 ^ 1),"!testModel.removeColumns(0, 0)",""
                                               ,
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x1b7);
                        if (cVar4 != '\0') {
                          local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
                          local_1c8[0]._8_8_ = (QVariant *)0x0;
                          local_1c8[0]._16_8_ = 0;
                          iVar6 = GenericModel::columnCount(&local_230);
                          cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1b8);
                          if (cVar4 != '\0') {
                            lVar14 = 0;
                            do {
                              cVar4 = QTest::qCompare(*(longlong *)
                                                       (*(long *)((long)local_1f8 + lVar14) + 0x20),
                                                      0,"spy->count()","0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1ba);
                              if (cVar4 == '\0') goto LAB_0010ce3d;
                              lVar14 = lVar14 + 8;
                            } while (lVar14 != 0x10);
                            local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
                            local_1c8[0]._8_8_ = (QVariant *)0x0;
                            local_1c8[0]._16_8_ = 0;
                            bVar5 = GenericModel::removeColumns
                                              ((int)&local_230,2,(QModelIndex *)0x0);
                            cVar4 = QTest::qVerify((bool)(bVar5 ^ 1),
                                                   "!testModel.removeColumns(2, 0)","",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1bb);
                            if (cVar4 != '\0') {
                              local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
                              local_1c8[0]._8_8_ = (QVariant *)0x0;
                              local_1c8[0]._16_8_ = 0;
                              iVar6 = GenericModel::columnCount(&local_230);
                              cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1bc);
                              if (cVar4 != '\0') {
                                lVar14 = 0;
                                do {
                                  cVar4 = QTest::qCompare(*(longlong *)
                                                           (*(long *)((long)local_1f8 + lVar14) +
                                                           0x20),0,"spy->count()","0",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1be);
                                  if (cVar4 == '\0') goto LAB_0010ce3d;
                                  lVar14 = lVar14 + 8;
                                } while (lVar14 != 0x10);
                                local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
                                local_1c8[0]._8_8_ = (QVariant *)0x0;
                                local_1c8[0]._16_8_ = 0;
                                bVar5 = GenericModel::removeColumns
                                                  ((int)&local_230,-1,(QModelIndex *)0x2);
                                cVar4 = QTest::qVerify((bool)(bVar5 ^ 1),
                                                       "!testModel.removeColumns(-1, 2)","",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1bf);
                                if (cVar4 != '\0') {
                                  local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
                                  local_1c8[0]._8_8_ = (QVariant *)0x0;
                                  local_1c8[0]._16_8_ = 0;
                                  iVar6 = GenericModel::columnCount(&local_230);
                                  cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c0);
                                  if (cVar4 != '\0') {
                                    lVar14 = 0;
                                    do {
                                      cVar4 = QTest::qCompare(*(longlong *)
                                                               (*(long *)((long)local_1f8 + lVar14)
                                                               + 0x20),0,"spy->count()","0",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c2);
                                      if (cVar4 == '\0') goto LAB_0010ce3d;
                                      lVar14 = lVar14 + 8;
                                    } while (lVar14 != 0x10);
                                    local_1c8[0]._forAlignment = (PrivateShared *)0xffffffffffffffff
                                    ;
                                    local_1c8[0]._8_8_ = (QVariant *)0x0;
                                    local_1c8[0]._16_8_ = 0;
                                    bVar5 = GenericModel::removeColumns
                                                      ((int)&local_230,9,(QModelIndex *)0x2);
                                    cVar4 = QTest::qVerify((bool)(bVar5 ^ 1),
                                                           "!testModel.removeColumns(9, 2)","",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c3);
                                    if (cVar4 != '\0') {
                                      local_1c8[0]._forAlignment =
                                           (PrivateShared *)0xffffffffffffffff;
                                      local_1c8[0]._8_8_ = (QVariant *)0x0;
                                      local_1c8[0]._16_8_ = 0;
                                      iVar6 = GenericModel::columnCount(&local_230);
                                      cVar4 = QTest::qCompare(iVar6,8,"testModel.columnCount()","8",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c4);
                                      if (cVar4 != '\0') {
                                        lVar14 = 0;
                                        do {
                                          bVar5 = QTest::qCompare(*(longlong *)
                                                                   (*(long *)((long)local_1f8 +
                                                                             lVar14) + 0x20),0,
                                                                  "spy->count()","0",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1c6);
                                          bVar3 = lVar14 != 8;
                                          lVar14 = lVar14 + 8;
                                        } while ((bVar5 & bVar3) != 0);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_0010ce3d;
  }
  goto LAB_0010cec4;
LAB_0010d82b:
  this_00 = local_1c8;
LAB_0010ce38:
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)this_00);
LAB_0010ce3d:
  local_130._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_130 + 0x58));
  if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
  QObject::~QObject(&local_130.super_QObject);
LAB_0010cec4:
  local_b0._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
  if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
  QObject::~QObject(&local_b0.super_QObject);
LAB_0010cf4b:
  QObject::~QObject((QObject *)local_140);
  GenericModel::~GenericModel((GenericModel *)&local_230);
  return;
}

Assistant:

void tst_GenericModel::removeColumns()
{
    QFETCH(int, insertRow);
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    if (insertRow > 0)
        testModel.insertRows(0, insertRow);
    QVERIFY(testModel.insertColumns(0, 13));
    testModel.setHeaderData(10, Qt::Horizontal, 1);

    QSignalSpy columnsAboutToBeRemovedSpy(&testModel, SIGNAL(columnsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(columnsAboutToBeRemovedSpy.isValid());
    QSignalSpy columnsRemovedSpy(&testModel, SIGNAL(columnsRemoved(QModelIndex, int, int)));
    QVERIFY(columnsRemovedSpy.isValid());
    QSignalSpy *const spyArr[] = {&columnsRemovedSpy, &columnsAboutToBeRemovedSpy};

    QVERIFY(testModel.removeColumns(0, 1));
    QCOMPARE(testModel.columnCount(), 12);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(9, Qt::Horizontal).toInt(), 1);
    QVERIFY(testModel.removeColumns(0, 2));
    QCOMPARE(testModel.columnCount(), 10);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(7, Qt::Horizontal).toInt(), 1);

    QVERIFY(testModel.removeColumns(2, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 3);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QCOMPARE(testModel.headerData(5, Qt::Horizontal).toInt(), 1);

    QVERIFY(!testModel.removeColumns(0, 0));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(2, 0));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(-1, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeColumns(9, 2));
    QCOMPARE(testModel.columnCount(), 8);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
}